

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlOrtho(double left,double right,double bottom,double top,double znear,double zfar)

{
  Matrix right_00;
  long lVar1;
  Matrix *pMVar2;
  Matrix matOrtho;
  long local_c8;
  long lStack_c0;
  undefined8 uStack_b0;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  pMVar2 = RLGL.State.currentMatrix;
  local_c8 = (ulong)(uint)(2.0 / (float)(top - bottom)) << 0x20;
  lStack_c0 = (ulong)(uint)(-((float)bottom + (float)top) / (float)(top - bottom)) << 0x20;
  right_00.m4 = 0.0;
  right_00.m0 = 2.0 / (float)(right - left);
  lVar1 = (ulong)(uint)(-((float)right + (float)left) / (float)(right - left)) << 0x20;
  right_00.m8 = (float)(int)lVar1;
  right_00.m12 = (float)(int)((ulong)lVar1 >> 0x20);
  right_00.m1 = (float)(undefined4)local_c8;
  right_00.m5 = (float)local_c8._4_4_;
  right_00.m9 = (float)(undefined4)lStack_c0;
  right_00.m13 = (float)lStack_c0._4_4_;
  right_00.m2 = 0.0;
  right_00.m6 = 0.0;
  right_00.m10 = -2.0 / (float)(zfar - znear);
  right_00.m14 = -((float)znear + (float)zfar) / (float)(zfar - znear);
  right_00.m3 = 0.0;
  right_00.m7 = 0.0;
  right_00.m11 = 0.0;
  right_00.m15 = 1.0;
  rlMatrixMultiply(*RLGL.State.currentMatrix,right_00);
  pMVar2->m3 = (float)(undefined4)local_20;
  pMVar2->m7 = (float)local_20._4_4_;
  pMVar2->m11 = (float)(undefined4)uStack_18;
  pMVar2->m15 = (float)uStack_18._4_4_;
  pMVar2->m2 = (float)(undefined4)local_30;
  pMVar2->m6 = (float)local_30._4_4_;
  pMVar2->m10 = (float)(undefined4)uStack_28;
  pMVar2->m14 = (float)uStack_28._4_4_;
  pMVar2->m1 = (float)(undefined4)local_40;
  pMVar2->m5 = (float)local_40._4_4_;
  pMVar2->m9 = (float)(undefined4)uStack_38;
  pMVar2->m13 = (float)uStack_38._4_4_;
  pMVar2->m0 = (float)(undefined4)local_50;
  pMVar2->m4 = (float)local_50._4_4_;
  pMVar2->m8 = (float)(undefined4)uStack_48;
  pMVar2->m12 = (float)uStack_48._4_4_;
  return;
}

Assistant:

void rlOrtho(double left, double right, double bottom, double top, double znear, double zfar)
{
    // NOTE: If left-right and top-botton values are equal it could create a division by zero,
    // response to it is platform/compiler dependant
    Matrix matOrtho = { 0 };

    float rl = (float)(right - left);
    float tb = (float)(top - bottom);
    float fn = (float)(zfar - znear);

    matOrtho.m0 = 2.0f/rl;
    matOrtho.m1 = 0.0f;
    matOrtho.m2 = 0.0f;
    matOrtho.m3 = 0.0f;
    matOrtho.m4 = 0.0f;
    matOrtho.m5 = 2.0f/tb;
    matOrtho.m6 = 0.0f;
    matOrtho.m7 = 0.0f;
    matOrtho.m8 = 0.0f;
    matOrtho.m9 = 0.0f;
    matOrtho.m10 = -2.0f/fn;
    matOrtho.m11 = 0.0f;
    matOrtho.m12 = -((float)left + (float)right)/rl;
    matOrtho.m13 = -((float)top + (float)bottom)/tb;
    matOrtho.m14 = -((float)zfar + (float)znear)/fn;
    matOrtho.m15 = 1.0f;

    *RLGL.State.currentMatrix = rlMatrixMultiply(*RLGL.State.currentMatrix, matOrtho);
}